

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_operation_node.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::SetOperationNode::Copy(SetOperationNode *this)

{
  SetOperationType SVar1;
  bool bVar2;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var3;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var4;
  pointer pSVar5;
  pointer pQVar6;
  type other;
  QueryNode *in_RSI;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_30;
  unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true> local_28
  ;
  
  make_uniq<duckdb::SetOperationNode>();
  SVar1 = *(SetOperationType *)&in_RSI[1]._vptr_QueryNode;
  pSVar5 = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
           ::operator->(&local_28);
  pSVar5->setop_type = SVar1;
  bVar2 = *(bool *)((long)&in_RSI[1]._vptr_QueryNode + 1);
  pSVar5 = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
           ::operator->(&local_28);
  pSVar5->setop_all = bVar2;
  pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )&in_RSI[1].type);
  (*pQVar6->_vptr_QueryNode[5])(&local_30,pQVar6);
  pSVar5 = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
           ::operator->(&local_28);
  _Var4._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (QueryNode *)0x0;
  _Var3._M_head_impl =
       (pSVar5->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar5->left).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_30._M_head_impl != (QueryNode *)0x0) {
      (*(local_30._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  pQVar6 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )&in_RSI[1].modifiers);
  (*pQVar6->_vptr_QueryNode[5])(&local_30,pQVar6);
  pSVar5 = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
           ::operator->(&local_28);
  _Var4._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (QueryNode *)0x0;
  _Var3._M_head_impl =
       (pSVar5->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar5->right).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var3._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_30._M_head_impl != (QueryNode *)0x0) {
      (*(local_30._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  other = unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>,_true>
          ::operator*(&local_28);
  QueryNode::CopyProperties(in_RSI,&other->super_QueryNode);
  (this->super_QueryNode)._vptr_QueryNode =
       (_func_int **)
       local_28.
       super_unique_ptr<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::SetOperationNode,_std::default_delete<duckdb::SetOperationNode>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SetOperationNode_*,_std::default_delete<duckdb::SetOperationNode>_>
       .super__Head_base<0UL,_duckdb::SetOperationNode_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> SetOperationNode::Copy() const {
	auto result = make_uniq<SetOperationNode>();
	result->setop_type = setop_type;
	result->setop_all = setop_all;
	result->left = left->Copy();
	result->right = right->Copy();
	this->CopyProperties(*result);
	return std::move(result);
}